

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall server_context::process_single_task(server_context *this,server_task *task)

{
  llama_tokens *this_00;
  slot_state sVar1;
  pointer psVar2;
  _Map_pointer ppsVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  server_slot *slot_1;
  server_slot *slot_00;
  common_log *pcVar11;
  long *__s;
  size_type sVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_t __n;
  undefined **ppuVar15;
  server_slot *slot;
  char *fmt;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  pointer psVar16;
  uint uVar17;
  int in_R8D;
  int iVar18;
  int iVar19;
  size_type sVar20;
  bool bVar21;
  string filename;
  string filepath;
  size_t token_count;
  string local_c0;
  server_task *local_a0;
  undefined1 local_98 [40];
  string local_70;
  llama_context *local_50;
  llama_context *local_48;
  json_value jStack_40;
  
  switch(task->type) {
  case SERVER_TASK_TYPE_COMPLETION:
  case SERVER_TASK_TYPE_EMBEDDING:
  case SERVER_TASK_TYPE_RERANK:
  case SERVER_TASK_TYPE_INFILL:
    if (task->id_selected_slot == -1) {
      slot_00 = get_available_slot(this,task);
    }
    else {
      for (slot_00 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          slot_00 !=
          (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
          super__Vector_impl_data._M_finish; slot_00 = slot_00 + 1) {
        if (slot_00->id == task->id_selected_slot) goto LAB_001950be;
      }
      slot_00 = (server_slot *)0x0;
    }
LAB_001950be:
    if (slot_00 == (server_slot *)0x0) {
      if (common_log_verbosity_thold < 1) goto LAB_00195130;
      pcVar11 = common_log_main();
      uVar17 = task->id;
      fmt = "srv  %12.*s: no slot is available, defer task, id_task = %d\n";
    }
    else {
      if (slot_00->state == SLOT_STATE_IDLE) {
        bVar21 = launch_slot_with_task(this,slot_00,task);
        if (bVar21) {
          return;
        }
        if (common_log_verbosity_thold < 0) {
          return;
        }
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,
                       "srv  %12.*s: failed to launch slot with task, id_task = %d\n",0xc,
                       "process_single_task",(ulong)(uint)task->id);
        return;
      }
      if (common_log_verbosity_thold < 1) goto LAB_00195130;
      pcVar11 = common_log_main();
      uVar17 = task->id;
      fmt = "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n";
    }
    common_log_add(pcVar11,GGML_LOG_LEVEL_DEBUG,fmt,0xc,"process_single_task",(ulong)uVar17);
LAB_00195130:
    server_queue::defer(&this->queue_tasks,task);
    return;
  case SERVER_TASK_TYPE_CANCEL:
    psVar16 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar16 != psVar2) {
      do {
        if (psVar16->id_task == task->id_target) {
          server_slot::release(psVar16);
          return;
        }
        psVar16 = psVar16 + 1;
      } while (psVar16 != psVar2);
    }
    break;
  case SERVER_TASK_TYPE_METRICS:
    iVar19 = 0;
    local_a0 = task;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_c0,(initializer_list_t)ZEXT816(0),false,array);
    psVar16 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar17 = 0;
    local_98._32_8_ = this;
    if (psVar16 != psVar2) {
      uVar17 = 0;
      iVar19 = 0;
      do {
        server_slot::to_json_abi_cxx11_((server_slot *)local_98);
        sVar1 = psVar16->state;
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_c0,
                    (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)local_98);
        bVar21 = sVar1 == SLOT_STATE_IDLE;
        uVar17 = uVar17 + bVar21;
        iVar19 = iVar19 + (uint)!bVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)local_98,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_98);
        psVar16 = psVar16 + 1;
      } while (psVar16 != psVar2);
    }
    if (0 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: n_idle_slots = %d, n_processing_slots = %d\n",0xc,
                     "process_single_task",(ulong)uVar17,iVar19);
    }
    __s = (long *)operator_new(0x90);
    uVar9 = local_98._32_8_;
    memset(__s,0,0x90);
    __s[1] = -1;
    *__s = (long)&PTR_is_error_002dfb70;
    __s[6] = 0;
    __s[7] = 0;
    __s[8] = 0;
    __s[9] = 0;
    __s[10] = 0;
    __s[0xb] = 0;
    __s[0xc] = 0;
    __s[0xd] = 0;
    __s[0xe] = 0;
    __s[0xf] = 0;
    iVar18 = 2;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)(__s + 0x10),(initializer_list_t)ZEXT816(0),false,array);
    *(int *)(__s + 1) = local_a0->id;
    local_48 = (llama_context *)local_c0._M_dataplus._M_p;
    jStack_40 = (json_value)local_c0._M_string_length;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c0,false);
    local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffffffffff00;
    local_c0._M_string_length = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_48,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)(__s + 0x10),
                (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_48);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_48,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_48);
    *(uint *)(__s + 2) = uVar17;
    *(int *)((long)__s + 0x14) = iVar19;
    ppsVar3 = (((server_queue *)(uVar9 + 0x1498))->queue_tasks_deferred).
              super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    uVar17 = (int)((ulong)((long)ppsVar3 -
                          (long)(((server_queue *)(uVar9 + 0x1498))->queue_tasks_deferred).
                                super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl
                                .super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
             (uint)(ppsVar3 == (_Map_pointer)0x0);
    __n = (size_t)uVar17;
    *(uint *)(__s + 3) =
         (int)((ulong)((long)(((server_queue *)(uVar9 + 0x1498))->queue_tasks_deferred).
                             super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                             super__Deque_impl_data._M_start._M_last -
                      (long)(((server_queue *)(uVar9 + 0x1498))->queue_tasks_deferred).
                            super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur) >> 3) * 0x14b2a7c3 +
         (int)((ulong)((long)(((server_queue *)(uVar9 + 0x1498))->queue_tasks_deferred).
                             super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_cur -
                      (long)(((server_queue *)(uVar9 + 0x1498))->queue_tasks_deferred).
                            super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_first) >> 3) * 0x14b2a7c3 + uVar17;
    __s[4] = ((server_metrics *)(uVar9 + 0x1688))->t_start;
    uVar10 = llama_kv_self_n_tokens(*(llama_context **)(uVar9 + 0x13a0));
    *(undefined4 *)(__s + 5) = uVar10;
    uVar10 = llama_kv_self_used_cells(*(llama_context **)(uVar9 + 0x13a0));
    *(undefined4 *)((long)__s + 0x2c) = uVar10;
    uVar8 = ((server_metrics *)(uVar9 + 0x1688))->t_prompt_processing_total;
    __s[6] = ((server_metrics *)(uVar9 + 0x1688))->n_prompt_tokens_processed_total;
    __s[7] = uVar8;
    uVar8 = ((server_metrics *)(uVar9 + 0x1688))->t_tokens_generation_total;
    __s[8] = ((server_metrics *)(uVar9 + 0x1688))->n_tokens_predicted_total;
    __s[9] = uVar8;
    uVar8 = ((server_metrics *)(uVar9 + 0x1688))->t_prompt_processing;
    __s[10] = ((server_metrics *)(uVar9 + 0x1688))->n_prompt_tokens_processed;
    __s[0xb] = uVar8;
    uVar8 = ((server_metrics *)(uVar9 + 0x1688))->t_tokens_generation;
    __s[0xc] = ((server_metrics *)(uVar9 + 0x1688))->n_tokens_predicted;
    __s[0xd] = uVar8;
    uVar8 = ((server_metrics *)(uVar9 + 0x1688))->n_busy_slots_total;
    __s[0xe] = ((server_metrics *)(uVar9 + 0x1688))->n_decode_total;
    __s[0xf] = uVar8;
    if (local_a0->metrics_reset_bucket == true) {
      ((server_metrics *)(uVar9 + 0x1688))->n_tokens_predicted = 0;
      ((server_metrics *)(uVar9 + 0x1688))->t_tokens_generation = 0;
      ((server_metrics *)(uVar9 + 0x1688))->n_prompt_tokens_processed = 0;
      ((server_metrics *)(uVar9 + 0x1688))->t_prompt_processing = 0;
    }
    local_98._0_8_ = __s;
    server_response::send((server_response *)(uVar9 + 0x15d8),(int)local_98,__buf_00,__n,iVar18);
    if ((long *)local_98._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 0x28))();
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c0,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_c0);
    break;
  case SERVER_TASK_TYPE_SLOT_SAVE:
    iVar19 = (task->slot_action).slot_id;
    for (psVar16 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        psVar16 !=
        (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
        super__Vector_impl_data._M_finish; psVar16 = psVar16 + 1) {
      if (psVar16->id == iVar19) goto LAB_0019517a;
    }
    psVar16 = (pointer)0x0;
LAB_0019517a:
    if (psVar16 == (pointer)0x0) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Invalid slot ID","");
      send_error(this,task->id,&local_c0,ERROR_TYPE_INVALID_REQUEST);
      goto LAB_00195776;
    }
    if (psVar16->state != SLOT_STATE_IDLE) {
      if (0 < common_log_verbosity_thold) {
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_DEBUG,
                       "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",0xc,
                       "process_single_task",(ulong)(uint)task->id);
      }
      goto LAB_00195130;
    }
    piVar5 = (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar6 = (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a0 = (server_task *)ggml_time_us();
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    pcVar4 = (task->slot_action).filename._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar4,pcVar4 + (task->slot_action).filename._M_string_length);
    local_98._0_8_ = local_98 + 0x10;
    pcVar4 = (task->slot_action).filepath._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar4,pcVar4 + (task->slot_action).filepath._M_string_length);
    sVar20 = (long)piVar5 - (long)piVar6 >> 2;
    sVar12 = sVar20;
    local_98._32_8_ =
         llama_state_seq_save_file
                   (this->ctx,local_98._0_8_,psVar16->id,
                    (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar18 = (int)sVar12;
    lVar13 = ggml_time_us();
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)operator_new(0x50);
    paVar14->_M_allocated_capacity = 0;
    (&paVar14->_M_allocated_capacity)[1] = 0;
    (&paVar14->_M_allocated_capacity)[2] = 0;
    (&paVar14->_M_allocated_capacity)[3] = 0;
    (&paVar14->_M_allocated_capacity)[4] = 0;
    (&paVar14->_M_allocated_capacity)[5] = 0;
    (&paVar14->_M_allocated_capacity)[8] = 0;
    (&paVar14->_M_allocated_capacity)[9] = 0;
    (&paVar14->_M_allocated_capacity)[6] = 0;
    (&paVar14->_M_allocated_capacity)[7] = 0;
    (&paVar14->_M_allocated_capacity)[1] = 0xffffffffffffffff;
    ppuVar15 = &PTR_is_error_002dfc48;
    paVar14->_M_allocated_capacity = (size_type)&PTR_is_error_002dfc48;
    (&paVar14->_M_allocated_capacity)[2] = (size_type)(&paVar14->_M_allocated_capacity + 4);
    (&paVar14->_M_allocated_capacity)[3] = 0;
    *(undefined1 *)(&paVar14->_M_allocated_capacity + 4) = 0;
    *(int *)(&paVar14->_M_allocated_capacity + 1) = task->id;
    *(int *)((long)paVar14 + 0xc) = iVar19;
    std::__cxx11::string::_M_assign((string *)(&paVar14->_M_allocated_capacity + 2));
    *(undefined1 *)(&paVar14->_M_allocated_capacity + 6) = 1;
    (&paVar14->_M_allocated_capacity)[7] = sVar20;
    (&paVar14->_M_allocated_capacity)[8] = local_98._32_8_;
    (&paVar14->_M_allocated_capacity)[9] = (size_type)((double)(lVar13 - (long)local_a0) / 1000.0);
    local_70._M_dataplus._M_p = (pointer)paVar14;
    server_response::send
              (&this->queue_results,(int)local_98 + 0x28,__buf_01,(size_t)ppuVar15,iVar18);
LAB_00195a6c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 0x28))();
    }
LAB_00195a7c:
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return;
    }
    goto LAB_00195780;
  case SERVER_TASK_TYPE_SLOT_RESTORE:
    iVar19 = (task->slot_action).slot_id;
    for (psVar16 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        psVar16 !=
        (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
        super__Vector_impl_data._M_finish; psVar16 = psVar16 + 1) {
      if (psVar16->id == iVar19) goto LAB_0019520f;
    }
    psVar16 = (pointer)0x0;
LAB_0019520f:
    if (psVar16 != (pointer)0x0) {
      if (psVar16->state != SLOT_STATE_IDLE) {
        if (0 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          common_log_add(pcVar11,GGML_LOG_LEVEL_DEBUG,
                         "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",
                         0xc,"process_single_task",(ulong)(uint)task->id);
        }
        goto LAB_00195130;
      }
      local_a0 = (server_task *)ggml_time_us();
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar4 = (task->slot_action).filename._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar4,pcVar4 + (task->slot_action).filename._M_string_length);
      local_98._0_8_ = local_98 + 0x10;
      pcVar4 = (task->slot_action).filepath._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar4,pcVar4 + (task->slot_action).filepath._M_string_length);
      this_00 = &psVar16->cache_tokens;
      httplib::detail::std::vector<int,_std::allocator<int>_>::resize(this_00,(long)psVar16->n_ctx);
      local_50 = (llama_context *)0x0;
      iVar18 = (int)((long)(psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
      sVar12 = llama_state_seq_load_file(this->ctx,local_98._0_8_,psVar16->id);
      if (sVar12 != 0) {
        httplib::detail::std::vector<int,_std::allocator<int>_>::resize(this_00,(size_type)local_50)
        ;
        lVar13 = ggml_time_us();
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x50);
        paVar14->_M_allocated_capacity = 0;
        (&paVar14->_M_allocated_capacity)[1] = 0;
        (&paVar14->_M_allocated_capacity)[2] = 0;
        (&paVar14->_M_allocated_capacity)[3] = 0;
        (&paVar14->_M_allocated_capacity)[4] = 0;
        (&paVar14->_M_allocated_capacity)[5] = 0;
        (&paVar14->_M_allocated_capacity)[8] = 0;
        (&paVar14->_M_allocated_capacity)[9] = 0;
        (&paVar14->_M_allocated_capacity)[6] = 0;
        (&paVar14->_M_allocated_capacity)[7] = 0;
        (&paVar14->_M_allocated_capacity)[1] = 0xffffffffffffffff;
        ppuVar15 = &PTR_is_error_002dfc48;
        paVar14->_M_allocated_capacity = (size_type)&PTR_is_error_002dfc48;
        (&paVar14->_M_allocated_capacity)[2] = (size_type)(&paVar14->_M_allocated_capacity + 4);
        (&paVar14->_M_allocated_capacity)[3] = 0;
        *(undefined1 *)(&paVar14->_M_allocated_capacity + 4) = 0;
        *(int *)(&paVar14->_M_allocated_capacity + 1) = task->id;
        *(int *)((long)paVar14 + 0xc) = iVar19;
        std::__cxx11::string::_M_assign((string *)(&paVar14->_M_allocated_capacity + 2));
        *(undefined1 *)(&paVar14->_M_allocated_capacity + 6) = 0;
        (&paVar14->_M_allocated_capacity)[7] = (size_type)local_50;
        (&paVar14->_M_allocated_capacity)[8] = sVar12;
        (&paVar14->_M_allocated_capacity)[9] =
             (size_type)((double)(lVar13 - (long)local_a0) / 1000.0);
        local_70._M_dataplus._M_p = (pointer)paVar14;
        server_response::send
                  (&this->queue_results,(int)local_98 + 0x28,__buf_02,(size_t)ppuVar15,iVar18);
        goto LAB_00195a6c;
      }
      httplib::detail::std::vector<int,_std::allocator<int>_>::resize(this_00,0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_98 + 0x28),
                 "Unable to restore slot, no available space in KV cache or invalid slot save file",
                 "");
      send_error(this,task->id,(string *)(local_98 + 0x28),ERROR_TYPE_INVALID_REQUEST);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00195a7c;
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Invalid slot ID","");
    send_error(this,task->id,&local_c0,ERROR_TYPE_INVALID_REQUEST);
    goto LAB_00195776;
  case SERVER_TASK_TYPE_SLOT_ERASE:
    iVar19 = (task->slot_action).slot_id;
    for (psVar16 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        psVar16 !=
        (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
        super__Vector_impl_data._M_finish; psVar16 = psVar16 + 1) {
      if (psVar16->id == iVar19) goto LAB_00195343;
    }
    psVar16 = (pointer)0x0;
LAB_00195343:
    if (psVar16 != (pointer)0x0) {
      if (psVar16->state != SLOT_STATE_IDLE) {
        if (0 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          common_log_add(pcVar11,GGML_LOG_LEVEL_DEBUG,
                         "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",
                         0xc,"process_single_task",(ulong)(uint)task->id);
        }
        goto LAB_00195130;
      }
      piVar5 = (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar6 = (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      llama_kv_self_seq_rm(this->ctx,psVar16->id,0xffffffff,0xffffffff);
      piVar7 = (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar7) {
        (psVar16->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar7;
      }
      local_c0._M_dataplus._M_p = (pointer)operator_new(0x18);
      *(long *)local_c0._M_dataplus._M_p = 0;
      *(long *)((long)local_c0._M_dataplus._M_p + 8) = 0;
      *(long *)((long)local_c0._M_dataplus._M_p + 0x10) = 0;
      *(long *)((long)local_c0._M_dataplus._M_p + 8) = -1;
      *(undefined ***)local_c0._M_dataplus._M_p = &PTR_is_error_002dfc88;
      uVar17 = task->id;
      *(uint *)((long)local_c0._M_dataplus._M_p + 8) = uVar17;
      *(int *)((long)local_c0._M_dataplus._M_p + 0xc) = iVar19;
      *(long *)((long)local_c0._M_dataplus._M_p + 0x10) = (long)piVar5 - (long)piVar6 >> 2;
      server_response::send(&this->queue_results,(int)&local_c0,__buf_03,(ulong)uVar17,in_R8D);
      goto LAB_001952f8;
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Invalid slot ID","");
    send_error(this,task->id,&local_c0,ERROR_TYPE_INVALID_REQUEST);
LAB_00195776:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return;
    }
LAB_00195780:
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    break;
  case SERVER_TASK_TYPE_SET_LORA:
    httplib::detail::std::
    vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::_M_move_assign
              (&(this->params_base).lora_adapters,&task->set_lora);
    local_c0._M_dataplus._M_p = (pointer)operator_new(0x10);
    *(long *)local_c0._M_dataplus._M_p = 0;
    *(long *)((long)local_c0._M_dataplus._M_p + 8) = 0;
    *(long *)((long)local_c0._M_dataplus._M_p + 8) = -1;
    *(undefined ***)local_c0._M_dataplus._M_p = &PTR_is_error_002dfcc8;
    uVar17 = task->id;
    *(uint *)((long)local_c0._M_dataplus._M_p + 8) = uVar17;
    server_response::send(&this->queue_results,(int)&local_c0,__buf,(ulong)uVar17,in_R8D);
LAB_001952f8:
    if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c0._M_dataplus._M_p + 0x28))();
    }
  }
  return;
}

Assistant:

void process_single_task(server_task && task) {
        switch (task.type) {
            case SERVER_TASK_TYPE_COMPLETION:
            case SERVER_TASK_TYPE_INFILL:
            case SERVER_TASK_TYPE_EMBEDDING:
            case SERVER_TASK_TYPE_RERANK:
                {
                    const int id_slot = task.id_selected_slot;

                    server_slot * slot = id_slot != -1 ? get_slot_by_id(id_slot) : get_available_slot(task);

                    if (slot == nullptr) {
                        // if no slot is available, we defer this task for processing later
                        SRV_DBG("no slot is available, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    if (!launch_slot_with_task(*slot, std::move(task))) {
                        SRV_ERR("failed to launch slot with task, id_task = %d\n", task.id);
                        break;
                    }
                } break;
            case SERVER_TASK_TYPE_CANCEL:
                {
                    // release slot linked with the task id
                    for (auto & slot : slots) {
                        if (slot.id_task == task.id_target) {
                            slot.release();
                            break;
                        }
                    }
                } break;
            case SERVER_TASK_TYPE_NEXT_RESPONSE:
                {
                    // do nothing
                } break;
            case SERVER_TASK_TYPE_METRICS:
                {
                    json slots_data = json::array();

                    int n_idle_slots       = 0;
                    int n_processing_slots = 0;

                    for (server_slot & slot : slots) {
                        json slot_data = slot.to_json();

                        if (slot.is_processing()) {
                            n_processing_slots++;
                        } else {
                            n_idle_slots++;
                        }

                        slots_data.push_back(slot_data);
                    }
                    SRV_DBG("n_idle_slots = %d, n_processing_slots = %d\n", n_idle_slots, n_processing_slots);

                    auto res = std::make_unique<server_task_result_metrics>();
                    res->id                  = task.id;
                    res->slots_data          = std::move(slots_data);
                    res->n_idle_slots        = n_idle_slots;
                    res->n_processing_slots  = n_processing_slots;
                    res->n_tasks_deferred    = queue_tasks.queue_tasks_deferred.size();
                    res->t_start             = metrics.t_start;

                    res->kv_cache_tokens_count = llama_kv_self_n_tokens(ctx);
                    res->kv_cache_used_cells   = llama_kv_self_used_cells(ctx);

                    res->n_prompt_tokens_processed_total = metrics.n_prompt_tokens_processed_total;
                    res->t_prompt_processing_total       = metrics.t_prompt_processing_total;
                    res->n_tokens_predicted_total        = metrics.n_tokens_predicted_total;
                    res->t_tokens_generation_total       = metrics.t_tokens_generation_total;

                    res->n_prompt_tokens_processed = metrics.n_prompt_tokens_processed;
                    res->t_prompt_processing       = metrics.t_prompt_processing;
                    res->n_tokens_predicted        = metrics.n_tokens_predicted;
                    res->t_tokens_generation       = metrics.t_tokens_generation;

                    res->n_decode_total          = metrics.n_decode_total;
                    res->n_busy_slots_total      = metrics.n_busy_slots_total;

                    if (task.metrics_reset_bucket) {
                        metrics.reset_bucket();
                    }
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_SAVE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const size_t token_count = slot->cache_tokens.size();
                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    const size_t nwrite = llama_state_seq_save_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_save_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = true;
                    res->n_tokens = token_count;
                    res->n_bytes  = nwrite;
                    res->t_ms     = t_save_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_RESTORE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    slot->cache_tokens.resize(slot->n_ctx);
                    size_t token_count = 0;
                    size_t nread = llama_state_seq_load_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), slot->cache_tokens.size(), &token_count);
                    if (nread == 0) {
                        slot->cache_tokens.resize(0);
                        send_error(task, "Unable to restore slot, no available space in KV cache or invalid slot save file", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    slot->cache_tokens.resize(token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_restore_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = false;
                    res->n_tokens = token_count;
                    res->n_bytes  = nread;
                    res->t_ms     = t_restore_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_ERASE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    // Erase token cache
                    const size_t n_erased = slot->cache_tokens.size();
                    llama_kv_self_seq_rm(ctx, slot->id, -1, -1);
                    slot->cache_tokens.clear();

                    auto res = std::make_unique<server_task_result_slot_erase>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->n_erased = n_erased;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SET_LORA:
                {
                    params_base.lora_adapters = std::move(task.set_lora);
                    auto res = std::make_unique<server_task_result_apply_lora>();
                    res->id = task.id;
                    queue_results.send(std::move(res));
                } break;
        }
    }